

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

qpdf_oh qpdf_oh_new_stream(qpdf_data qpdf)

{
  qpdf_oh qVar1;
  QPDFObjectHandle local_20;
  
  QPDF::newStream((QPDF *)&local_20);
  qVar1 = new_object(qpdf,&local_20);
  if (local_20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_stream(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_stream");
    return new_object(qpdf, qpdf->qpdf->newStream());
}